

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::updateDual(HDual *this)

{
  int *in_RDI;
  HModel *unaff_retaddr;
  int i;
  double in_stack_00000018;
  HDualRow *in_stack_00000020;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  int iCol;
  int *piVar2;
  
  if (in_RDI[0x57] == 0) {
    if ((*(double *)(in_RDI + 0x1b6) != 0.0) || (NAN(*(double *)(in_RDI + 0x1b6)))) {
      piVar2 = in_RDI;
      HDualRow::update_dual(in_stack_00000020,in_stack_00000018);
      iCol = (int)((ulong)piVar2 >> 0x20);
      if ((*in_RDI != 0) && (in_RDI[0x1c2] != 0)) {
        for (iVar1 = 0; iCol = (int)((ulong)piVar2 >> 0x20), iVar1 < in_RDI[0x1c1];
            iVar1 = iVar1 + 1) {
          HDualRow::update_dual(in_stack_00000020,in_stack_00000018);
        }
      }
    }
    else {
      piVar2 = in_RDI;
      HModel::shiftCost(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                        (double)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
      iCol = (int)((ulong)piVar2 >> 0x20);
    }
    *(undefined8 *)(*(long *)(in_RDI + 0x30) + (long)in_RDI[0x1b3] * 8) = 0;
    *(ulong *)(*(long *)(in_RDI + 0x30) + (long)in_RDI[0x1b1] * 8) =
         *(ulong *)(in_RDI + 0x1b6) ^ 0x8000000000000000;
    HModel::shiftBack(unaff_retaddr,iCol);
  }
  return;
}

Assistant:

void HDual::updateDual() {
	if (invertHint)
		return;

	// Update - dual (shift and back)
	if (thetaDual == 0)
		model->shiftCost(columnIn, -workDual[columnIn]);
	else {
		dualRow.update_dual(thetaDual);
		if (dual_variant != HDUAL_VARIANT_PLAIN && slice_PRICE)
			for (int i = 0; i < slice_num; i++)
				slice_dualRow[i].update_dual(thetaDual);
	}
	workDual[columnIn] = 0;
	workDual[columnOut] = -thetaDual;
	model->shiftBack(columnOut);
}